

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

string * __thiscall
WorldShuffler::random_hint_for_item_abi_cxx11_
          (string *__return_storage_ptr__,WorldShuffler *this,Item *item)

{
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  allocator<char> local_31;
  _Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> local_30;
  
  RandomizerWorld::item_sources_with_item
            ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_30,this->_world,item);
  if (local_30._M_impl.super__Vector_impl_data._M_start ==
      local_30._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"in an unknown place",&local_31);
  }
  else {
    vectools::shuffle<ItemSource*>
              ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_30,&this->_rng);
    random_hint_for_item_source_abi_cxx11_
              (__return_storage_ptr__,this,*local_30._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string WorldShuffler::random_hint_for_item(Item* item)
{
    std::vector<ItemSource*> sources = _world.item_sources_with_item(item);
    if(sources.empty())
        return "in an unknown place";

    vectools::shuffle(sources, _rng);
    ItemSource* randomSource = sources[0];
    return this->random_hint_for_item_source(randomSource);
}